

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

int lj_meta_tailcall(lua_State *L,cTValue *tv)

{
  TValue *pTVar1;
  TValue *pTVar2;
  TValue TVar3;
  BCIns *pc;
  TValue *top;
  TValue *base;
  cTValue *tv_local;
  lua_State *L_local;
  
  pTVar1 = L->base;
  pTVar2 = L->top;
  TVar3 = pTVar1[-1];
  pTVar1[-2] = *tv;
  pTVar2->u64 = 0;
  pTVar2[1] = TVar3;
  pTVar2[2].u64 = (ulong)L | 0xfffc800000000000;
  pTVar2[3].u64 = (long)(pTVar2 + 3) + (10 - (long)pTVar1);
  L->top = pTVar2 + 4;
  L->base = pTVar2 + 4;
  return 0;
}

Assistant:

int lj_meta_tailcall(lua_State *L, cTValue *tv)
{
  TValue *base = L->base;
  TValue *top = L->top;
  const BCIns *pc = frame_pc(base-1);  /* Preserve old PC from frame. */
  copyTV(L, base-1-LJ_FR2, tv);  /* Replace frame with new object. */
  if (LJ_FR2)
    (top++)->u64 = LJ_CONT_TAILCALL;
  else
    top->u32.lo = LJ_CONT_TAILCALL;
  setframe_pc(top++, pc);
  setframe_gc(top, obj2gco(L), LJ_TTHREAD);  /* Dummy frame object. */
  if (LJ_FR2) top++;
  setframe_ftsz(top, ((char *)(top+1) - (char *)base) + FRAME_CONT);
  L->base = L->top = top+1;
  /*
  ** before:   [old_mo|PC]    [... ...]
  **                         ^base     ^top
  ** after:    [new_mo|itype] [... ...] [NULL|PC] [dummy|delta]
  **                                                           ^base/top
  ** tailcall: [new_mo|PC]    [... ...]
  **                         ^base     ^top
  */
  return 0;
}